

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O3

void __thiscall
de::ArrayBuffer<unsigned_char,_1UL,_1UL>::ArrayBuffer
          (ArrayBuffer<unsigned_char,_1UL,_1UL> *this,uchar *ptr,size_t numElements)

{
  void *ptr_00;
  size_t sVar1;
  size_t storageSize;
  ArrayBuffer<unsigned_char,_1UL,_1UL> local_30;
  
  this->m_ptr = (void *)0x0;
  this->m_cap = 0;
  if (numElements != 0) {
    ArrayBuffer(&local_30,numElements);
    memcpy(local_30.m_ptr,ptr,(long)(int)numElements);
    ptr_00 = this->m_ptr;
    sVar1 = this->m_cap;
    this->m_ptr = local_30.m_ptr;
    this->m_cap = local_30.m_cap;
    local_30.m_ptr = ptr_00;
    local_30.m_cap = sVar1;
    detail::ArrayBuffer_AlignedFree(ptr_00);
  }
  return;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>::ArrayBuffer (const T* ptr, size_t numElements)
	: m_ptr	(DE_NULL)
	, m_cap	(0)
{
	if (numElements)
	{
		// create new buffer of wanted size, copy to it, and swap to it
		ArrayBuffer<T,Alignment,Stride> tmp(numElements);

		if (Stride == sizeof(T))
		{
			// tightly packed
			const size_t storageSize = sizeof(T) * numElements;
			deMemcpy(tmp.m_ptr, ptr, (int)storageSize);
		}
		else
		{
			// sparsely packed
			for (size_t ndx = 0; ndx < numElements; ++ndx)
				*tmp.getElementPtr(ndx) = ptr[ndx];
		}

		swap(tmp);
	}
}